

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
helics::FederateState::getCommand_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FederateState *this)

{
  CommonCore *pCVar1;
  bool bVar2;
  int iVar3;
  optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  val;
  undefined4 local_f0;
  undefined4 uStack_e8;
  _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  uint7 uStack_87;
  undefined8 uStack_80;
  _Storage<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
  local_78;
  bool local_38;
  
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
  ::try_pop((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_e0,&this->commandQueue);
  if (local_e0._M_engaged == true) {
    do {
      iVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0
                      ,"notify");
      if (iVar3 != 0) break;
      pCVar1 = this->mParent;
      if (pCVar1 != (CommonCore *)0x0) {
        local_f0 = (undefined4)(this->name)._M_string_length;
        uStack_e8 = SUB84((this->name)._M_dataplus._M_p,0);
        (*(pCVar1->super_Core)._vptr_Core[0x5b])
                  (pCVar1,local_e0._M_payload._M_value.second._M_string_length,
                   local_e0._M_payload._M_value.second._M_dataplus._M_p,0xf,"notify_response",0,
                   local_f0,uStack_e8);
      }
      gmlc::containers::
      BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
      ::try_pop((optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_78,&this->commandQueue);
      std::
      _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_e0,
                       (_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_78);
      if (local_38 == true) {
        std::
        _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_destroy((_Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_78);
      }
    } while (local_e0._M_engaged != false);
  }
  bVar2 = local_e0._M_engaged;
  if (local_e0._M_engaged == true) {
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)__return_storage_ptr__,
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&local_e0);
  }
  else {
    local_78._M_value.first._M_dataplus._M_p = (_Alloc_hider)((long)&local_78._M_value + 0x10);
    local_98 = &local_88;
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
         CONCAT17(local_78._24_1_,local_78._17_7_);
    *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_78._25_4_;
    *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_78._29_2_;
    (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_78._31_1_;
    (__return_storage_ptr__->first)._M_string_length = 0;
    local_78._M_value.first._M_string_length = 0;
    local_78._16_1_ = 0;
    (__return_storage_ptr__->second)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->second).field_2;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = (ulong)uStack_87 << 8;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_80;
    (__return_storage_ptr__->second)._M_string_length = 0;
    local_90 = 0;
    local_88 = 0;
  }
  if (bVar2 == false) {
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
    if (local_78._M_value.first._M_dataplus._M_p != (pointer)((long)&local_78._M_value + 0x10U)) {
      operator_delete((void *)local_78._M_value.first._M_dataplus._M_p,
                      CONCAT71(local_78._17_7_,local_78._16_1_) + 1);
    }
  }
  if (local_e0._M_engaged == true) {
    std::
    _Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_destroy(&local_e0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> FederateState::getCommand()
{
    auto val = commandQueue.try_pop();
    while (val && val->first == "notify") {
        if (mParent != nullptr) {
            mParent->sendCommand(val->second,
                                 "notify_response",
                                 name,
                                 HelicsSequencingModes::HELICS_SEQUENCING_MODE_FAST);
        }
        val = commandQueue.try_pop();
    }
    return (val) ? *val : std::pair<std::string, std::string>{std::string{}, std::string{}};
}